

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O0

void __thiscall tst_qpromise_then::functionPtrHandlers(tst_qpromise_then *this)

{
  bool bVar1;
  byte bVar2;
  float local_12c;
  float local_128;
  float local_124;
  code *local_120;
  QPromise<float> local_118;
  undefined1 local_108 [8];
  Promise p2_1;
  QPromise<float> local_f0;
  undefined1 local_e0 [8];
  Promise p1_1;
  QPromise<void> local_c8;
  undefined1 local_b8 [8];
  Promise p0_1;
  float local_9c;
  code *local_98;
  QPromise<float> local_90;
  undefined1 local_80 [8];
  Promise p2;
  QPromise<float> local_68;
  undefined1 local_58 [8];
  Promise p1;
  QPromise<void> local_30;
  undefined1 local_20 [8];
  Promise p0;
  tst_qpromise_then *this_local;
  
  p0.super_QPromiseBase<float>.m_d.d = (PromiseData<float> *)this;
  QtPromise::resolve();
  QtPromise::QPromiseBase<void>::then<float(*)()>
            ((QPromiseBase<void> *)local_20,(_func_float **)&local_30);
  QtPromise::QPromise<void>::~QPromise(&local_30);
  QtPromise::resolve<float_const&>((QtPromise *)&local_68,(float *)&(anonymous_namespace)::kRes);
  p2.super_QPromiseBase<float>.m_d.d = (PromiseData<float> *)anon_unknown.dwarf_21302::fnArgByVal;
  QtPromise::QPromiseBase<float>::then<float(*)(float)>
            ((QPromiseBase<float> *)local_58,(_func_float_float **)&local_68);
  QtPromise::QPromise<float>::~QPromise(&local_68);
  QtPromise::resolve<float_const&>((QtPromise *)&local_90,(float *)&(anonymous_namespace)::kRes);
  local_98 = anon_unknown.dwarf_21302::fnArgByRef;
  QtPromise::QPromiseBase<float>::then<float(*)(float_const&)>
            ((QPromiseBase<float> *)local_80,(_func_float_float_ptr **)&local_90);
  QtPromise::QPromise<float>::~QPromise(&local_90);
  local_9c = waitForValue<float>((QPromise<float> *)local_20,(float *)&(anonymous_namespace)::kFail)
  ;
  bVar2 = QTest::qCompare(&local_9c,(float *)&(anonymous_namespace)::kRes,"waitForValue(p0, kFail)",
                          "kRes",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0xbc);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    p0_1.super_QPromiseBase<float>.m_d.d._4_4_ =
         waitForValue<float>((QPromise<float> *)local_58,(float *)&(anonymous_namespace)::kFail);
    bVar2 = QTest::qCompare((float *)((long)&p0_1.super_QPromiseBase<float>.m_d.d + 4),
                            (float *)&(anonymous_namespace)::kRes,"waitForValue(p1, kFail)","kRes",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                            ,0xbd);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      p0_1.super_QPromiseBase<float>.m_d.d._0_4_ =
           waitForValue<float>((QPromise<float> *)local_80,(float *)&(anonymous_namespace)::kFail);
      bVar2 = QTest::qCompare((float *)&p0_1.super_QPromiseBase<float>.m_d,
                              (float *)&(anonymous_namespace)::kRes,"waitForValue(p2, kFail)","kRes"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                              ,0xbe);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
    }
    else {
      bVar1 = true;
    }
  }
  else {
    bVar1 = true;
  }
  QtPromise::QPromise<float>::~QPromise((QPromise<float> *)local_80);
  QtPromise::QPromise<float>::~QPromise((QPromise<float> *)local_58);
  QtPromise::QPromise<float>::~QPromise((QPromise<float> *)local_20);
  if (!bVar1) {
    QtPromise::resolve();
    p1_1.super_QPromiseBase<float>.m_d.d =
         (PromiseData<float> *)anon_unknown.dwarf_21302::Klass::kFnNoArg;
    QtPromise::QPromiseBase<void>::then<float(*)()>
              ((QPromiseBase<void> *)local_b8,(_func_float **)&local_c8);
    QtPromise::QPromise<void>::~QPromise(&local_c8);
    QtPromise::resolve<float_const&>((QtPromise *)&local_f0,(float *)&(anonymous_namespace)::kRes);
    p2_1.super_QPromiseBase<float>.m_d.d =
         (PromiseData<float> *)anon_unknown.dwarf_21302::Klass::kFnArgByVal;
    QtPromise::QPromiseBase<float>::then<float(*)(float)>
              ((QPromiseBase<float> *)local_e0,(_func_float_float **)&local_f0);
    QtPromise::QPromise<float>::~QPromise(&local_f0);
    QtPromise::resolve<float_const&>((QtPromise *)&local_118,(float *)&(anonymous_namespace)::kRes);
    local_120 = anon_unknown.dwarf_21302::Klass::kFnArgByRef;
    QtPromise::QPromiseBase<float>::then<float(*)(float_const&)>
              ((QPromiseBase<float> *)local_108,(_func_float_float_ptr **)&local_118);
    QtPromise::QPromise<float>::~QPromise(&local_118);
    local_124 = waitForValue<float>((QPromise<float> *)local_b8,
                                    (float *)&(anonymous_namespace)::kFail);
    bVar2 = QTest::qCompare(&local_124,(float *)&(anonymous_namespace)::kRes,
                            "waitForValue(p0, kFail)","kRes",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                            ,0xc5);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      local_128 = waitForValue<float>((QPromise<float> *)local_e0,
                                      (float *)&(anonymous_namespace)::kFail);
      bVar2 = QTest::qCompare(&local_128,(float *)&(anonymous_namespace)::kRes,
                              "waitForValue(p1, kFail)","kRes",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                              ,0xc6);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        local_12c = waitForValue<float>((QPromise<float> *)local_108,
                                        (float *)&(anonymous_namespace)::kFail);
        QTest::qCompare(&local_12c,(float *)&(anonymous_namespace)::kRes,"waitForValue(p2, kFail)",
                        "kRes",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                        ,199);
      }
    }
    QtPromise::QPromise<float>::~QPromise((QPromise<float> *)local_108);
    QtPromise::QPromise<float>::~QPromise((QPromise<float> *)local_e0);
    QtPromise::QPromise<float>::~QPromise((QPromise<float> *)local_b8);
  }
  return;
}

Assistant:

void tst_qpromise_then::functionPtrHandlers()
{
    { // Global functions.
        auto p0 = QtPromise::resolve().then(&fnNoArg);
        auto p1 = QtPromise::resolve(kRes).then(&fnArgByVal);
        auto p2 = QtPromise::resolve(kRes).then(&fnArgByRef);

        QCOMPARE(waitForValue(p0, kFail), kRes);
        QCOMPARE(waitForValue(p1, kFail), kRes);
        QCOMPARE(waitForValue(p2, kFail), kRes);
    }
    { // Static member functions.
        auto p0 = QtPromise::resolve().then(&Klass::kFnNoArg);
        auto p1 = QtPromise::resolve(kRes).then(&Klass::kFnArgByVal);
        auto p2 = QtPromise::resolve(kRes).then(&Klass::kFnArgByRef);

        QCOMPARE(waitForValue(p0, kFail), kRes);
        QCOMPARE(waitForValue(p1, kFail), kRes);
        QCOMPARE(waitForValue(p2, kFail), kRes);
    }
}